

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_1::CheckRequiredCapabilities
          (ValidationState_t *state,Instruction *inst,size_t which_operand,
          spv_parsed_operand_t *operand,uint32_t word)

{
  AssemblyGrammar *this;
  spv_operand_type_t type;
  uint uVar1;
  uint uVar2;
  spv_operand_desc val;
  bool bVar3;
  spv_result_t sVar4;
  DiagnosticStream *pDVar5;
  char cVar6;
  Instruction *pIVar7;
  size_t cardinal;
  long lVar8;
  size_t cardinal_00;
  size_t cardinal_01;
  ExtensionSet *extensions;
  spv_result_t sVar9;
  char *pcVar10;
  ulong uVar11;
  Extension *value;
  ExtensionSet required_extensions;
  spv_operand_desc operand_desc;
  CapabilitySet enabling_capabilities;
  string local_2b8;
  utils *local_290;
  Instruction *local_288;
  spv_operand_desc local_280;
  EnumSet<spv::Capability> local_278;
  spv_operand_desc local_258;
  string local_250;
  char *local_230;
  string local_228;
  undefined1 local_208 [24];
  size_t local_1f0;
  EnumSet<spv::Capability> *this_00;
  
  type = operand->type;
  if (type == SPV_OPERAND_TYPE_FP_ROUNDING_MODE) {
    cVar6 = (state->features_).free_fp_rounding_mode;
joined_r0x001e063a:
    if (cVar6 != '\0') {
      return SPV_SUCCESS;
    }
  }
  else if (type == SPV_OPERAND_TYPE_GROUP_OPERATION) {
    if (word < 3) {
      cVar6 = (state->features_).group_ops_reduce_and_scans;
      goto joined_r0x001e063a;
    }
  }
  else if (((type == SPV_OPERAND_TYPE_BUILT_IN) && (word < 5)) &&
          ((0x1aU >> (word & 0x1f) & 1) != 0)) {
    return SPV_SUCCESS;
  }
  local_278.buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278.size_ = 0;
  local_278.buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.buckets_.
  super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_280 = (spv_operand_desc)0x0;
  this = &state->grammar_;
  local_290 = (utils *)which_operand;
  sVar4 = AssemblyGrammar::lookupOperand(this,type,word,&local_280);
  this_00 = (EnumSet<spv::Capability> *)0x0;
  sVar9 = SPV_SUCCESS;
  if (sVar4 == SPV_SUCCESS) {
    if ((operand->type == SPV_OPERAND_TYPE_DECORATION) && (local_280->value == 0x27)) {
      if ((state->features_).free_fp_rounding_mode != false) goto LAB_001e0672;
      bVar3 = spvIsVulkanEnv(state->context_->target_env);
      if (bVar3) {
        local_2b8._M_dataplus._M_p._0_4_ = 0x1151;
        this_00 = &local_278;
        EnumSet<spv::Capability>::insert
                  ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)local_208,this_00,
                   (Capability *)&local_2b8);
        local_2b8._M_dataplus._M_p._0_4_ = 0x1152;
        EnumSet<spv::Capability>::insert
                  ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)local_208,this_00,
                   (Capability *)&local_2b8);
        local_2b8._M_dataplus._M_p._0_4_ = 0x1153;
        EnumSet<spv::Capability>::insert
                  ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)local_208,this_00,
                   (Capability *)&local_2b8);
        local_2b8._M_dataplus._M_p._0_4_ = 0x1154;
        EnumSet<spv::Capability>::insert
                  ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)local_208,this_00,
                   (Capability *)&local_2b8);
      }
    }
    else {
      AssemblyGrammar::filterCapsAgainstTargetEnv
                ((CapabilitySet *)local_208,this,local_280->capabilities,local_280->numCapabilities)
      ;
      this_00 = &local_278;
      std::
      vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
      ::operator=(&this_00->buckets_,
                  (vector<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                   *)local_208);
      local_278.size_ = local_1f0;
      if ((EnumSet<spv::Capability> *)local_208._0_8_ != (EnumSet<spv::Capability> *)0x0) {
        operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
      }
    }
    sVar9 = (spv_result_t)this_00;
    if ((inst->inst_).opcode != 0x11) {
      bVar3 = ValidationState_t::HasAnyOfCapabilities(state,&local_278);
      cVar6 = local_278.size_ == 0 || bVar3;
      if (local_278.size_ != 0 && !bVar3) {
        local_288 = (Instruction *)CONCAT71(local_288._1_7_,cVar6);
        pIVar7 = inst;
        ValidationState_t::diag
                  ((DiagnosticStream *)local_208,state,SPV_ERROR_INVALID_CAPABILITY,inst);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Operand ",8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," of ",4);
        local_250._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
        pDVar5 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_250);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar5," requires one of these capabilities: ",0x25);
        (anonymous_namespace)::ToString_abi_cxx11_
                  (&local_2b8,(_anonymous_namespace_ *)&local_278,(CapabilitySet *)this,
                   (AssemblyGrammar *)pIVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar5,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
        sVar9 = pDVar5->error_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        cVar6 = (char)local_288;
      }
      if (cVar6 == '\0') goto LAB_001e0672;
    }
    val = local_280;
    uVar1 = state->version_;
    uVar2 = local_280->minVersion;
    sVar9 = SPV_SUCCESS;
    if ((local_280->lastVersion < uVar1 || uVar1 < uVar2) || uVar2 == 0xffffffff) {
      if (local_280->lastVersion < uVar1) {
        ValidationState_t::diag((DiagnosticStream *)local_208,state,SPV_ERROR_WRONG_VERSION,inst);
        utils::CardinalToOrdinal_abi_cxx11_(&local_2b8,local_290,cardinal);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," operand of ",0xc);
        local_250._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
        pDVar5 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_250);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5,": operand ",10);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,&val->name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5,"(",1);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar5,") requires SPIR-V version ",0x1a);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5,".",1);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar5);
        pcVar10 = " or earlier";
        lVar8 = 0xb;
      }
      else {
        if (local_280->numExtensions != 0 || uVar2 == 0xffffffff) {
          uVar11 = (ulong)local_280->numExtensions;
          local_258 = local_280;
          value = local_280->extensions;
          local_2b8.field_2._M_allocated_capacity = 0;
          local_2b8.field_2._8_8_ = 0;
          local_2b8._M_dataplus._M_p = (char *)0x0;
          local_2b8._M_string_length = 0;
          local_288 = inst;
          if (uVar11 != 0) {
            do {
              EnumSet<spvtools::Extension>::insert
                        ((pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> *)local_208,
                         (EnumSet<spvtools::Extension> *)&local_2b8,value);
              value = value + 1;
              uVar11 = uVar11 - 1;
            } while (uVar11 != 0);
          }
          bVar3 = ValidationState_t::HasAnyOfExtensions(state,(ExtensionSet *)&local_2b8);
          pIVar7 = local_288;
          sVar9 = SPV_SUCCESS;
          if (!bVar3) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_208,state,SPV_ERROR_MISSING_EXTENSION,local_288);
            utils::CardinalToOrdinal_abi_cxx11_(&local_250,local_290,cardinal_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," operand of ",0xc);
            local_230 = spvOpcodeString((uint)(pIVar7->inst_).opcode);
            pDVar5 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_230);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5,": operand ",10);
            pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_258->name);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5,"(",1);
            std::ostream::_M_insert<unsigned_long>((ulong)pDVar5);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar5,") requires one of these extensions: ",0x24);
            ExtensionSetToString_abi_cxx11_(&local_228,(spvtools *)&local_2b8,extensions);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)pDVar5,local_228._M_dataplus._M_p,local_228._M_string_length);
            sVar9 = pDVar5->error_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
          }
          if (local_2b8._M_dataplus._M_p != (char *)0x0) {
            operator_delete(local_2b8._M_dataplus._M_p,
                            local_2b8.field_2._M_allocated_capacity -
                            (long)local_2b8._M_dataplus._M_p);
          }
          goto LAB_001e0672;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,state,SPV_ERROR_WRONG_VERSION,inst);
        utils::CardinalToOrdinal_abi_cxx11_(&local_2b8,local_290,cardinal_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," operand of ",0xc);
        local_250._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
        pDVar5 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_250);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5,": operand ",10);
        pDVar5 = DiagnosticStream::operator<<(pDVar5,&val->name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5,"(",1);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar5,") requires SPIR-V version ",0x1a);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5,".",1);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar5);
        pcVar10 = " or later";
        lVar8 = 9;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar5,pcVar10,lVar8);
      sVar9 = pDVar5->error_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    }
  }
LAB_001e0672:
  if (local_278.buckets_.
      super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.buckets_.
                    super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.buckets_.
                          super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.buckets_.
                          super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return sVar9;
}

Assistant:

spv_result_t CheckRequiredCapabilities(ValidationState_t& state,
                                       const Instruction* inst,
                                       size_t which_operand,
                                       const spv_parsed_operand_t& operand,
                                       uint32_t word) {
  // Mere mention of PointSize, ClipDistance, or CullDistance in a Builtin
  // decoration does not require the associated capability.  The use of such
  // a variable value should trigger the capability requirement, but that's
  // not implemented yet.  This rule is independent of target environment.
  // See https://github.com/KhronosGroup/SPIRV-Tools/issues/365
  if (operand.type == SPV_OPERAND_TYPE_BUILT_IN) {
    switch (spv::BuiltIn(word)) {
      case spv::BuiltIn::PointSize:
      case spv::BuiltIn::ClipDistance:
      case spv::BuiltIn::CullDistance:
        return SPV_SUCCESS;
      default:
        break;
    }
  } else if (operand.type == SPV_OPERAND_TYPE_FP_ROUNDING_MODE) {
    // Allow all FP rounding modes if requested
    if (state.features().free_fp_rounding_mode) {
      return SPV_SUCCESS;
    }
  } else if (operand.type == SPV_OPERAND_TYPE_GROUP_OPERATION &&
             state.features().group_ops_reduce_and_scans &&
             (word <= uint32_t(spv::GroupOperation::ExclusiveScan))) {
    // Allow certain group operations if requested.
    return SPV_SUCCESS;
  }

  CapabilitySet enabling_capabilities;
  spv_operand_desc operand_desc = nullptr;
  const auto lookup_result =
      state.grammar().lookupOperand(operand.type, word, &operand_desc);
  if (lookup_result == SPV_SUCCESS) {
    // Allow FPRoundingMode decoration if requested.
    if (operand.type == SPV_OPERAND_TYPE_DECORATION &&
        spv::Decoration(operand_desc->value) ==
            spv::Decoration::FPRoundingMode) {
      if (state.features().free_fp_rounding_mode) return SPV_SUCCESS;

      // Vulkan API requires more capabilities on rounding mode.
      if (spvIsVulkanEnv(state.context()->target_env)) {
        enabling_capabilities.insert(
            spv::Capability::StorageUniformBufferBlock16);
        enabling_capabilities.insert(spv::Capability::StorageUniform16);
        enabling_capabilities.insert(spv::Capability::StoragePushConstant16);
        enabling_capabilities.insert(spv::Capability::StorageInputOutput16);
      }
    } else {
      enabling_capabilities = state.grammar().filterCapsAgainstTargetEnv(
          operand_desc->capabilities, operand_desc->numCapabilities);
    }

    // When encountering an OpCapability instruction, the instruction pass
    // registers a capability with the module *before* checking capabilities.
    // So in the case of an OpCapability instruction, don't bother checking
    // enablement by another capability.
    if (inst->opcode() != spv::Op::OpCapability) {
      const bool enabled_by_cap =
          state.HasAnyOfCapabilities(enabling_capabilities);
      if (!enabling_capabilities.empty() && !enabled_by_cap) {
        return state.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
               << "Operand " << which_operand << " of "
               << spvOpcodeString(inst->opcode())
               << " requires one of these capabilities: "
               << ToString(enabling_capabilities, state.grammar());
      }
    }
    return OperandVersionExtensionCheck(state, inst, which_operand,
                                        *operand_desc, word);
  }
  return SPV_SUCCESS;
}